

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QActionPrivate::redoGrab(QActionPrivate *this,QShortcutMap *map)

{
  QList<int> *this_00;
  int iVar1;
  ShortcutContext context;
  QObject *owner;
  int *piVar2;
  bool bVar3;
  ContextMatcher matcher;
  long lVar4;
  long lVar5;
  QKeySequence *shortcut;
  QKeySequence *this_01;
  long in_FS_OFFSET;
  QKeySequence local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  owner = *(QObject **)&this->field_0x8;
  this_00 = &this->shortcutIds;
  lVar4 = (this->shortcutIds).d.size;
  if (lVar4 != 0) {
    piVar2 = (this->shortcutIds).d.ptr;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)piVar2 + lVar5);
      if (iVar1 != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::removeShortcut(map,iVar1,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
      lVar5 = lVar5 + 4;
    } while (lVar4 << 2 != lVar5);
  }
  QList<int>::clear(this_00);
  lVar4 = (this->shortcuts).d.size;
  if (lVar4 != 0) {
    this_01 = (this->shortcuts).d.ptr;
    lVar4 = lVar4 << 3;
    do {
      bVar3 = QKeySequence::isEmpty(this_01);
      if (bVar3) {
        local_40.d._0_4_ = 0;
      }
      else {
        context = this->shortcutContext;
        matcher = (ContextMatcher)(**(code **)(*(long *)this + 0x28))(this);
        local_40.d._0_4_ = QShortcutMap::addShortcut(map,owner,this_01,context,matcher);
      }
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)this_00,(this->shortcutIds).d.size,(int *)&local_40);
      QList<int>::end(this_00);
      this_01 = this_01 + 1;
      lVar4 = lVar4 + -8;
    } while (lVar4 != 0);
  }
  if (((this->field_0x188 & 1) == 0) && (lVar4 = (this->shortcutIds).d.size, lVar4 != 0)) {
    piVar2 = (this->shortcutIds).d.ptr;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)piVar2 + lVar5);
      if (iVar1 != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::setShortcutEnabled(map,false,iVar1,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
      lVar5 = lVar5 + 4;
    } while (lVar4 << 2 != lVar5);
  }
  if (((this->field_0x174 & 1) == 0) && (lVar4 = (this->shortcutIds).d.size, lVar4 != 0)) {
    piVar2 = (this->shortcutIds).d.ptr;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)piVar2 + lVar5);
      if (iVar1 != 0) {
        QKeySequence::QKeySequence(&local_40);
        QShortcutMap::setShortcutAutoRepeat(map,false,iVar1,owner,&local_40);
        QKeySequence::~QKeySequence(&local_40);
      }
      lVar5 = lVar5 + 4;
    } while (lVar4 << 2 != lVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QActionPrivate::redoGrab(QShortcutMap &map)
{
    Q_Q(QAction);
    for (int id : std::as_const(shortcutIds)) {
        if (id)
            map.removeShortcut(id, q);
    }

    shortcutIds.clear();
    for (const QKeySequence &shortcut : std::as_const(shortcuts)) {
        if (!shortcut.isEmpty())
            shortcutIds.append(map.addShortcut(q, shortcut, shortcutContext, contextMatcher()));
        else
            shortcutIds.append(0);
    }
    if (!enabled) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutEnabled(false, id, q);
        }
    }
    if (!autorepeat) {
        for (int id : std::as_const(shortcutIds)) {
            if (id)
                map.setShortcutAutoRepeat(false, id, q);
        }
    }
}